

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UCIOption.h
# Opt level: O0

void __thiscall libchess::UCIComboOption::set_option(UCIComboOption *this,value_type *value)

{
  bool bVar1;
  UCIOption<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_RSI;
  value_type *in_RDI;
  
  bVar1 = is_allowed(this,value);
  if (bVar1) {
    UCIOption<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    set_option(in_RSI,in_RDI);
  }
  return;
}

Assistant:

void set_option(const value_type& value) noexcept override {
        if (is_allowed(value)) {
            UCIOption<value_type>::set_option(value);
        }
    }